

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgn.h
# Opt level: O1

bool __thiscall pgn::find_move<(Piece)4>(pgn *this,position *p,Square *to,Move *m,int row,int col)

{
  Square *pSVar1;
  U8 UVar2;
  byte bVar3;
  Square SVar4;
  bool bVar5;
  U8 UVar6;
  U64 UVar7;
  U64 UVar8;
  byte bVar9;
  ulong uVar10;
  ulong uVar11;
  Square *s;
  Move *m_00;
  U8 *pUVar12;
  bool bVar13;
  long lVar14;
  Movegen mvs;
  Movegen local_3a8;
  
  Movegen::Movegen(&local_3a8,p);
  if (*local_3a8.queens != no_square) {
    s = local_3a8.queens;
    do {
      UVar7 = magics::attacks<(Piece)2>(&local_3a8.all_pieces,s);
      UVar8 = magics::attacks<(Piece)3>(&local_3a8.all_pieces,s);
      uVar10 = local_3a8.qtarget & (UVar8 | UVar7);
      if (uVar10 != 0) {
        SVar4 = *s;
        uVar11 = (ulong)local_3a8.last;
        pUVar12 = &local_3a8.list[uVar11].type;
        do {
          lVar14 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          ((Move *)(pUVar12 + -2))->f = (char)SVar4;
          pUVar12[-1] = (U8)lVar14;
          *pUVar12 = '\n';
          pUVar12 = pUVar12 + 3;
          local_3a8.last = (int)uVar11 + 1;
          uVar11 = (ulong)(uint)local_3a8.last;
          uVar10 = uVar10 & uVar10 - 1;
        } while (uVar10 != 0);
      }
      uVar10 = (UVar8 | UVar7) & local_3a8.ctarget;
      if (uVar10 != 0) {
        SVar4 = *s;
        uVar11 = (ulong)local_3a8.last;
        pUVar12 = &local_3a8.list[uVar11].type;
        do {
          lVar14 = 0;
          if (uVar10 != 0) {
            for (; (uVar10 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
            }
          }
          ((Move *)(pUVar12 + -2))->f = (char)SVar4;
          pUVar12[-1] = (U8)lVar14;
          *pUVar12 = '\v';
          pUVar12 = pUVar12 + 3;
          local_3a8.last = (int)uVar11 + 1;
          uVar11 = (ulong)(uint)local_3a8.last;
          uVar10 = uVar10 & uVar10 - 1;
        } while (uVar10 != 0);
      }
      pSVar1 = s + 1;
      s = s + 1;
    } while (*pSVar1 != no_square);
  }
  bVar13 = 0 < local_3a8.last;
  if (0 < local_3a8.last) {
    UVar2 = m->type;
    m_00 = local_3a8.list;
    lVar14 = 0;
    do {
      bVar5 = position::is_legal(p,m_00);
      if (bVar5) {
        if (UVar2 == '\x11') {
          bVar3 = m_00->t;
          if (*to == (uint)bVar3) {
            if (((row < 0) || (bVar9 = m_00->f, (uint)(bVar9 >> 3) != row)) &&
               ((col < 0 || (bVar9 = m_00->f, (bVar9 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e9e3;
              m->f = m_00->f;
            }
            else {
              m->f = bVar9;
            }
            m->t = bVar3;
            UVar6 = m_00->type;
LAB_0011ea2d:
            m->type = UVar6;
            break;
          }
        }
        else {
          UVar6 = m_00->type;
          if ((m->type == UVar6) && (bVar3 = m_00->t, *to == (uint)bVar3)) {
            if (((row < 0) || (bVar9 = m_00->f, (uint)(bVar9 >> 3) != row)) &&
               ((col < 0 || (bVar9 = m_00->f, (bVar9 & 7) != col)))) {
              if (-1 < (col & row)) goto LAB_0011e9e3;
              m->f = m_00->f;
            }
            else {
              m->f = bVar9;
            }
            m->t = bVar3;
            goto LAB_0011ea2d;
          }
        }
      }
LAB_0011e9e3:
      lVar14 = lVar14 + 1;
      m_00 = m_00 + 1;
      bVar13 = lVar14 < local_3a8.last;
    } while (lVar14 < local_3a8.last);
  }
  Movegen::~Movegen(&local_3a8);
  return bVar13;
}

Assistant:

bool pgn::find_move(position& p, const Square& to, Move& m, int row, int col) {

	Movegen mvs(p);
	mvs.generate<piece>();
	bool promotion = (m.type != Movetype::no_type);


	for (int j = 0; j < mvs.size(); ++j) {

		if (!p.is_legal(mvs[j])) continue;

		if (promotion && m.type == mvs[j].type && mvs[j].t == to) {

			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

		else if (!promotion && mvs[j].t == to) {
			if (row >= 0 && row == util::row(mvs[j].f)) { m = mvs[j]; return true; }
			if (col >= 0 && col == util::col(mvs[j].f)) { m = mvs[j]; return true; }
			if (col < 0 && row < 0) { m = mvs[j]; return true; }
		}

	}
	return false;
}